

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O2

shared_ptr<IC> __thiscall Infector::Container::buildSingle<IC>(Container *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<IC> sVar2;
  __buckets_ptr local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  buildSingle_delegate<IC>((Container *)&stack0xffffffffffffffe8);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->singleIstances)._M_h._M_buckets = local_18;
  (this->singleIstances)._M_h._M_bucket_count = (size_type)_Var1._M_pi;
  local_18 = (__buckets_ptr)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  sVar2.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<IC>)sVar2.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> Container::buildSingle(){
        return std::move(buildSingle_delegate<T>());
    }